

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_options.cpp
# Opt level: O0

bool __thiscall
Clasp::Cli::ClaspCliConfig::finalizeAppConfig
          (ClaspCliConfig *this,uint8 mode,ParsedOpts *parsed,ProblemType t,bool defs)

{
  HeuParams HVar1;
  bool bVar2;
  int iVar3;
  uint32 uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SolverParams *this_00;
  SolverParams *out;
  undefined8 *puVar6;
  char *pcVar7;
  char *pcVar8;
  byte in_SIL;
  long in_RDI;
  byte in_R8B;
  SolveParams *search;
  SolverParams *solver;
  uint32 i;
  char *err;
  char *ctx;
  ConfigIter conf;
  string m;
  uint8 c;
  SolveParams defSearch;
  SolverParams defSolver;
  UserConfig *config;
  undefined8 in_stack_fffffffffffffe48;
  ClaspConfig *in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  uint32 in_stack_fffffffffffffe98;
  uint8 mode_00;
  uint uVar9;
  char *pcVar10;
  ClaspCliConfig *this_01;
  uint local_10c;
  ProblemType in_stack_ffffffffffffff0c;
  ParsedOpts *in_stack_ffffffffffffff10;
  ConfigIter in_stack_ffffffffffffff18;
  ClaspCliConfig *in_stack_ffffffffffffff20;
  uint8 local_bd;
  undefined8 local_bc;
  undefined8 uStack_b4;
  undefined8 local_ac;
  undefined8 uStack_a4;
  undefined8 local_9c;
  undefined8 uStack_94;
  undefined8 local_8c;
  undefined8 uStack_84;
  undefined8 local_7c;
  undefined8 uStack_74;
  undefined8 local_6c;
  undefined8 uStack_64;
  undefined8 local_5c;
  undefined8 uStack_54;
  SolverStrategies local_4c;
  undefined4 uStack_44;
  anon_union_4_2_f967d777_for_HeuParams_9 aStack_40;
  undefined4 local_3c;
  undefined4 uStack_38;
  undefined4 local_34;
  BasicSatConfig *local_30;
  byte local_25;
  byte local_11;
  byte local_1;
  SolverStrategies *pSVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  local_25 = in_R8B & 1;
  local_11 = in_SIL;
  local_30 = active(in_stack_fffffffffffffe50,(uint8)((ulong)in_stack_fffffffffffffe48 >> 0x38));
  if ((local_30 == (BasicSatConfig *)0x0) ||
     ((char)(local_30->super_ContextParams).field_0x8 < '\0')) {
    local_1 = 1;
  }
  else {
    iVar3 = (*(local_30->super_UserConfiguration).super_Configuration._vptr_Configuration[6])
                      (local_30,0);
    pSVar5 = (SolverStrategies *)CONCAT44(extraout_var,iVar3);
    local_4c = *pSVar5;
    uStack_44 = SUB84(pSVar5[1],0);
    aStack_40.extra = SUB84(pSVar5[1],4);
    local_3c = SUB84(pSVar5[2],0);
    uStack_38 = SUB84(pSVar5[2],4);
    local_34 = *(undefined4 *)(pSVar5 + 3);
    iVar3 = (*(local_30->super_UserConfiguration).super_Configuration._vptr_Configuration[7])
                      (local_30,0);
    memcpy(&local_bc,(void *)CONCAT44(extraout_var_00,iVar3),0x70);
    local_bd = (local_30->super_ContextParams).cliConfig;
    if ((local_bd == '\x13') &&
       (uVar4 = mt::ParallelSolveOptions::numSolver((ParallelSolveOptions *)(in_RDI + 0x40)),
       uVar4 == 1)) {
      local_bd = '\0';
    }
    if ((((local_bd == '\0') && ((local_4c._4_4_ >> 0x13 & 1) != 1)) &&
        (bVar2 = isTester(local_11), !bVar2)) &&
       (uVar4 = mt::ParallelSolveOptions::numSolver((ParallelSolveOptions *)(in_RDI + 0x40)),
       uVar4 != 1)) {
      mt::ParallelSolveOptions::defaultPortfolio((ParallelSolveOptions *)(in_RDI + 0x40));
    }
    if (((local_25 & 1) == 0) ||
       (bVar2 = setAppDefaults(in_stack_ffffffffffffff20,
                               (ConfigKey)((ulong)in_stack_ffffffffffffff18.base_ >> 0x20),
                               (uint8)((ulong)in_stack_ffffffffffffff18.base_ >> 0x18),
                               in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c), bVar2)) {
      std::__cxx11::string::string((string *)&stack0xffffffffffffff20);
      getConfig((ClaspCliConfig *)defSearch.reduce._28_8_,defSearch.reduce.growSched.len._3_1_,
                (string *)defSearch.reduce._12_8_);
      local_11 = local_11 | 4;
      bVar2 = isTester(local_11);
      if (bVar2) {
        pcVar10 = "tester";
      }
      else {
        pcVar10 = "config";
      }
      local_10c = 0;
      this_01 = (ClaspCliConfig *)pcVar10;
      while( true ) {
        uVar9 = local_10c;
        uVar4 = mt::ParallelSolveOptions::numSolver((ParallelSolveOptions *)(in_RDI + 0x40));
        mode_00 = false;
        if (uVar9 != uVar4) {
          mode_00 = ConfigIter::valid((ConfigIter *)&stack0xffffffffffffff18);
        }
        if ((bool)mode_00 == false) break;
        iVar3 = (*(local_30->super_UserConfiguration).super_Configuration._vptr_Configuration[0xb])
                          (local_30,(ulong)local_10c);
        this_00 = (SolverParams *)CONCAT44(extraout_var_01,iVar3);
        HVar1.field_9.extra = aStack_40.extra;
        HVar1._0_4_ = uStack_44;
        *(ulong *)&(this_00->heuristic).field_9 = CONCAT44(local_3c,aStack_40.extra);
        *(ulong *)&this_00->seed = CONCAT44(local_34,uStack_38);
        this_00->super_SolverStrategies = local_4c;
        this_00->heuristic = HVar1;
        out = SolverParams::setId(this_00,local_10c);
        iVar3 = (*(local_30->super_UserConfiguration).super_Configuration._vptr_Configuration[0xc])
                          (local_30,(ulong)local_10c);
        puVar6 = (undefined8 *)CONCAT44(extraout_var_02,iVar3);
        puVar6[0xc] = local_5c;
        puVar6[0xd] = uStack_54;
        puVar6[10] = local_6c;
        puVar6[0xb] = uStack_64;
        puVar6[8] = local_7c;
        puVar6[9] = uStack_74;
        puVar6[6] = local_8c;
        puVar6[7] = uStack_84;
        puVar6[4] = local_9c;
        puVar6[5] = uStack_94;
        puVar6[2] = local_ac;
        puVar6[3] = uStack_a4;
        *puVar6 = local_bc;
        puVar6[1] = uStack_b4;
        bVar2 = setConfig(this_01,(ConfigIter *)CONCAT44(uVar4,uVar9),mode_00,
                          in_stack_fffffffffffffe98,(ParsedOpts *)this_00,(ParsedOpts *)out);
        if (!bVar2) {
          local_1 = 0;
          goto LAB_00142935;
        }
        pcVar7 = Cli::validate((SolverParams *)
                               CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                               (SolveParams *)in_stack_fffffffffffffe50);
        if (pcVar7 != (char *)0x0) {
          pcVar8 = ConfigIter::name((ConfigIter *)&stack0xffffffffffffff18);
          Potassco::fail(-2,
                         "bool Clasp::Cli::ClaspCliConfig::finalizeAppConfig(uint8, const ParsedOpts &, ProblemType, bool)"
                         ,0x4a5,"(err = Clasp::Cli::validate(solver, search)) == 0","<%s>.%s : %s",
                         pcVar10,pcVar8,pcVar7,0);
        }
        ConfigIter::next((ConfigIter *)in_stack_fffffffffffffe50);
        local_11 = local_11 | 1;
        local_10c = local_10c + 1;
      }
      (local_30->super_ContextParams).field_0x8 =
           (local_30->super_ContextParams).field_0x8 & 0x7f | 0x80;
      local_1 = 1;
LAB_00142935:
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff20);
    }
    else {
      local_1 = 0;
    }
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool ClaspCliConfig::finalizeAppConfig(uint8 mode, const ParsedOpts& parsed, ProblemType t, bool defs) {
	UserConfig* config = active(this, mode);
	if (!config || config->hasConfig) { return true; }
	SolverParams defSolver = config->solver(0);
	SolveParams  defSearch = config->search(0);
	uint8 c = config->cliConfig;
	if (c == config_many && solve.numSolver() == 1) { c = config_default; }
	if (c == config_default) {
		if      (defSolver.search == SolverParams::no_learning)       { c = config_nolearn; }
		else if (isTester(mode))                                      { c = config_tester_default; }
		else if (solve.numSolver() == 1 || !solve.defaultPortfolio()) { c = t == Problem_t::Asp ? (uint8)config_asp_default : (uint8)config_sat_default; }
		else                                                          { c = config_many; }
	}
	if (defs && !setAppDefaults(static_cast<ConfigKey>(c), mode, parsed, t)) { return false; }
	std::string m;
	ConfigIter conf = getConfig(c, m);
	mode           |= mode_relaxed;
	const char* ctx = isTester(mode) ? "tester" : "config", *err = 0;
	for (uint32 i = 0; i != solve.numSolver() && conf.valid(); ++i) {
		SolverParams& solver = (config->addSolver(i) = defSolver).setId(i);
		SolveParams&  search = (config->addSearch(i) = defSearch);
		if (!setConfig(conf, mode, i, parsed, 0)) {
			return false;
		}
		POTASSCO_REQUIRE((err = Clasp::Cli::validate(solver, search)) == 0, "<%s>.%s : %s", ctx, conf.name(), err);
		conf.next();
		mode |= mode_solver;
	}
	config->hasConfig = 1;
	return true;
}